

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.c
# Opt level: O3

int xmlVRaiseError(xmlStructuredErrorFunc schannel,xmlGenericErrorFunc channel,void *data,void *ctx,
                  xmlNode *node,int domain,int code,xmlErrorLevel level,char *file,int line,
                  char *str1,char *str2,char *str3,int int1,int col,char *msg,__va_list_tag *ap)

{
  ushort uVar1;
  _xmlNode *p_Var2;
  xmlStructuredErrorFunc p_Var3;
  xmlGenericErrorFunc channel_00;
  xmlError *to;
  int *piVar4;
  long lVar5;
  xmlStructuredErrorFunc *pp_Var6;
  void **ppvVar7;
  xmlGenericErrorFunc *pp_Var8;
  int iVar9;
  int iVar10;
  void *ctxt;
  xmlError *err;
  
  to = xmlGetLastErrorInternal();
  if (code == 0) {
    return 0;
  }
  piVar4 = __xmlGetWarningsDefaultValue();
  if ((level == XML_ERR_WARNING) && (*piVar4 == 0)) {
    return 0;
  }
  ctxt = (void *)0x0;
  err = to;
  if ((((uint)domain < 0x18) && ((0x80013aU >> (domain & 0x1fU) & 1) != 0)) &&
     (ctxt = ctx, err = (xmlError *)((long)ctx + 600), ctx == (void *)0x0)) {
    err = to;
  }
  if (node == (xmlNode *)0x0) {
    node = (xmlNodePtr)0x0;
  }
  else {
    iVar9 = 10;
    do {
      if ((node->type == XML_ELEMENT_NODE) || (p_Var2 = node->parent, p_Var2 == (_xmlNode *)0x0))
      break;
      iVar9 = iVar9 + -1;
      node = p_Var2;
    } while (iVar9 != 0);
    if (file == (char *)0x0) {
      if (node->doc == (_xmlDoc *)0x0) {
        file = (char *)0x0;
      }
      else {
        file = (char *)node->doc->URL;
      }
    }
    if (line == 0) {
      if (node->type == XML_ELEMENT_NODE) {
        uVar1 = node->line;
        line = (int)uVar1;
        if ((uVar1 != 0xffff) && (uVar1 != 0)) goto LAB_0012fa53;
      }
      lVar5 = xmlGetLineNo(node);
      line = (int)lVar5;
    }
  }
LAB_0012fa53:
  iVar9 = xmlVSetError(err,ctxt,node,domain,code,level,file,line,str1,str2,str3,int1,col,msg,ap);
  iVar10 = -1;
  if ((iVar9 == 0) && ((err == to || (iVar9 = xmlCopyError(err,to), -1 < iVar9)))) {
    if (schannel == (xmlStructuredErrorFunc)0x0) {
      pp_Var6 = __xmlStructuredError();
      if (*pp_Var6 == (xmlStructuredErrorFunc)0x0) {
        if (channel == (xmlGenericErrorFunc)0x0) {
          return 0;
        }
        if ((((channel != xmlParserValidityWarning) && (channel != xmlParserValidityError)) &&
            (channel != xmlParserWarning)) &&
           ((channel != xmlGenericErrorDefaultFunc && (channel != xmlParserError)))) {
          (*channel)(data,"%s",err->message);
          return 0;
        }
        pp_Var8 = __xmlGenericError();
        channel_00 = *pp_Var8;
        ppvVar7 = __xmlGenericErrorContext();
        xmlFormatError(err,channel_00,*ppvVar7);
        return 0;
      }
      pp_Var6 = __xmlStructuredError();
      p_Var3 = *pp_Var6;
      ppvVar7 = __xmlStructuredErrorContext();
      (*p_Var3)(*ppvVar7,err);
    }
    else {
      (*schannel)(data,err);
    }
    iVar10 = 0;
  }
  return iVar10;
}

Assistant:

int
xmlVRaiseError(xmlStructuredErrorFunc schannel,
               xmlGenericErrorFunc channel, void *data, void *ctx,
               xmlNode *node, int domain, int code, xmlErrorLevel level,
               const char *file, int line, const char *str1,
               const char *str2, const char *str3, int int1, int col,
               const char *msg, va_list ap)
{
    xmlParserCtxtPtr ctxt = NULL;
    /* xmlLastError is a macro retrieving the per-thread global. */
    xmlErrorPtr lastError = xmlGetLastErrorInternal();
    xmlErrorPtr to = lastError;

    if (code == XML_ERR_OK)
        return(0);
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
    if (code == XML_ERR_INTERNAL_ERROR)
        xmlAbort("Unexpected error: %d\n", code);
#endif
    if ((xmlGetWarningsDefaultValue == 0) && (level == XML_ERR_WARNING))
        return(0);

    if ((domain == XML_FROM_PARSER) || (domain == XML_FROM_HTML) ||
        (domain == XML_FROM_DTD) || (domain == XML_FROM_NAMESPACE) ||
	(domain == XML_FROM_IO) || (domain == XML_FROM_VALID)) {
	ctxt = (xmlParserCtxtPtr) ctx;

        if (ctxt != NULL)
            to = &ctxt->lastError;
    }

    if (xmlVUpdateError(to, ctxt, node, domain, code, level, file, line,
                        str1, str2, str3, int1, col, msg, ap))
        return(-1);

    if (to != lastError) {
        if (xmlCopyError(to, lastError) < 0)
            return(-1);
    }

    if (schannel != NULL) {
	schannel(data, to);
    } else if (xmlStructuredError != NULL) {
        xmlStructuredError(xmlStructuredErrorContext, to);
    } else if (channel != NULL) {
        /* Don't invoke legacy error handlers */
        if ((channel == xmlGenericErrorDefaultFunc) ||
            (channel == xmlParserError) ||
            (channel == xmlParserWarning) ||
            (channel == xmlParserValidityError) ||
            (channel == xmlParserValidityWarning))
            xmlFormatError(to, xmlGenericError, xmlGenericErrorContext);
        else
	    channel(data, "%s", to->message);
    }

    return(0);
}